

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::~FBSCodeGenerator(FBSCodeGenerator *this)

{
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit FBSCodeGenerator(const bool no_log) : no_log_(no_log) {}